

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::ZeroCopyCodedInputStream::Next
          (ZeroCopyCodedInputStream *this,void **data,int *size)

{
  bool bVar1;
  void **in_RDX;
  CodedInputStream *in_RSI;
  int *in_RDI;
  
  bVar1 = io::CodedInputStream::GetDirectBufferPointer(in_RSI,in_RDX,in_RDI);
  if (bVar1) {
    io::CodedInputStream::Skip(in_RSI,(int)((ulong)in_RDX >> 0x20));
  }
  return bVar1;
}

Assistant:

bool Next(const void** data, int* size) final {
    if (!cis_->GetDirectBufferPointer(data, size)) return false;
    cis_->Skip(*size);
    return true;
  }